

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaffeConverterPython.cpp
# Opt level: O0

PyObject * PyInit_libcaffeconverter(void)

{
  int iVar1;
  undefined8 uVar2;
  error_already_set *e;
  exception *e_1;
  int local_18;
  int local_14;
  int minor;
  int major;
  
  uVar2 = Py_GetVersion();
  iVar1 = __isoc99_sscanf(uVar2,"%i.%i",&local_14,&local_18);
  if (iVar1 == 2) {
    if ((local_14 == 3) && (local_18 == 10)) {
      _minor = pybind11_init();
    }
    else {
      PyErr_Format(_PyExc_ImportError,
                   "Python version mismatch: module was compiled for version %i.%i, while the interpreter is running version %i.%i."
                   ,3,10,local_14,local_18);
      _minor = (PyObject *)0x0;
    }
  }
  else {
    PyErr_SetString(_PyExc_ImportError,"Can\'t parse Python version.");
    _minor = (PyObject *)0x0;
  }
  return _minor;
}

Assistant:

PYBIND11_PLUGIN(libcaffeconverter) {
    py::module m("libcaffeconverter", "C++ Caffe converter implementation");
    m.def("_convert_to_file", &convertCaffe, "Convert a Caffe model to mlmodel format.");
    return m.ptr();
}